

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Cube::setupRightFace(Cube *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int i;
  long lVar3;
  float local_48 [2];
  undefined8 local_40;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  undefined8 local_1c;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_48[1] = this->y;
  uVar1 = this->z;
  uVar2 = this->l;
  local_4 = this->b + (float)uVar1;
  local_48[0] = this->x + (float)uVar2;
  local_40 = CONCAT44(local_48[0],local_4);
  local_38 = local_48[1];
  local_34 = (float)uVar1;
  local_30 = local_48[0];
  local_2c = this->h + local_48[1];
  local_28 = (float)uVar1;
  local_24 = local_48[0];
  local_20 = local_48[1];
  local_1c = CONCAT44(local_48[0],local_4);
  local_14 = local_2c;
  local_10 = (float)uVar1;
  local_c = local_48[0];
  local_8 = local_2c;
  for (lVar3 = 0; lVar3 != 0x12; lVar3 = lVar3 + 1) {
    this->positionData[lVar3 + 0x36] = local_48[lVar3];
  }
  return;
}

Assistant:

void setupRightFace() {
        float rightFace[]={

            x+l,y,z+b,
            x+l,y,z,
            x+l,y+h,z,
            x+l,y,z+b,
            x+l,y+h,z,
            x+l,y+h,z+b
        };

        arrayCopy(rightFace,positionData,54);
    }